

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

uint64_t __thiscall doublechecked::Roaring::and_cardinality(Roaring *this,Roaring *r)

{
  bool bVar1;
  reference puVar2;
  reference puVar3;
  uint64_t count;
  iterator r_it_end;
  iterator r_it;
  iterator it_end;
  iterator it;
  uint64_t ans;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar5;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  uint64_t local_18;
  
  local_18 = roaring::Roaring::and_cardinality
                       ((Roaring *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (Roaring *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_20._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_28._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_30._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_38._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar1 = std::operator==(&local_20,&local_28);
  if ((bVar1) || (bVar1 = std::operator==(&local_30,&local_38), bVar1)) {
    _assert_true(CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
  }
  else {
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                       ((_Rb_tree_const_iterator<unsigned_int> *)0x10de02);
    uVar4 = *puVar2;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::rbegin
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    puVar3 = std::reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_>::operator*
                       ((reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffa4);
    if (uVar4 <= *puVar3) {
      puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                         ((_Rb_tree_const_iterator<unsigned_int> *)0x10de40);
      in_stack_ffffffffffffff9c = *puVar2;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::rbegin
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      puVar3 = std::reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_>::operator*
                         ((reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      uVar5 = CONCAT13(*puVar3 < in_stack_ffffffffffffff9c,(int3)uVar5);
    }
    if ((char)((uint)uVar5 >> 0x18) == '\0') {
      while( true ) {
        bVar1 = std::operator!=(&local_20,&local_28);
        in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 & 0xffffff;
        if (bVar1) {
          bVar1 = std::operator!=(&local_30,&local_38);
          in_stack_ffffffffffffff98 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff98);
        }
        if ((char)(in_stack_ffffffffffffff98 >> 0x18) == '\0') break;
        puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                           ((_Rb_tree_const_iterator<unsigned_int> *)0x10defb);
        in_stack_ffffffffffffff94 = *puVar2;
        puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                           ((_Rb_tree_const_iterator<unsigned_int> *)0x10df0b);
        if (in_stack_ffffffffffffff94 == *puVar2) {
          std::_Rb_tree_const_iterator<unsigned_int>::operator++
                    ((_Rb_tree_const_iterator<unsigned_int> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          std::_Rb_tree_const_iterator<unsigned_int>::operator++
                    ((_Rb_tree_const_iterator<unsigned_int> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        }
        else {
          puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                             ((_Rb_tree_const_iterator<unsigned_int> *)0x10df44);
          in_stack_ffffffffffffff90 = *puVar2;
          puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                             ((_Rb_tree_const_iterator<unsigned_int> *)0x10df54);
          if (in_stack_ffffffffffffff90 < *puVar2) {
            std::_Rb_tree_const_iterator<unsigned_int>::operator++
                      ((_Rb_tree_const_iterator<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          }
          else {
            std::_Rb_tree_const_iterator<unsigned_int>::operator++
                      ((_Rb_tree_const_iterator<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          }
        }
      }
      _assert_true(CONCAT44(uVar5,uVar4),
                   (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c);
    }
    else {
      _assert_true(CONCAT44(uVar5,uVar4),
                   (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c);
    }
  }
  return local_18;
}

Assistant:

uint64_t and_cardinality(const Roaring &r) const {
        uint64_t ans = plain.and_cardinality(r.plain);

        auto it = check.begin();
        auto it_end = check.end();
        auto r_it = r.check.begin();
        auto r_it_end = r.check.end();
        if (it == it_end || r_it == r_it_end) {
            assert_true(ans == 0);  // if either is empty then no intersection
        } else if (*it > *r.check.rbegin() || *r_it > *check.rbegin()) {
            assert_true(ans == 0);  // obvious disjoint
        } else {                    // may overlap
            uint64_t count = 0;
            while (it != it_end && r_it != r_it_end) {
                if (*it == *r_it) {
                    ++count;
                    ++it;
                    ++r_it;
                }  // count overlap
                else if (*it < *r_it) {
                    ++it;
                } else {
                    ++r_it;
                }
            }
            assert_true(ans == count);
        }

        return ans;
    }